

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

void __thiscall
jsonnet::internal::anon_unknown_0::Interpreter::joinArray
          (Interpreter *this,bool *first,
          vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
          *running,Value *sep,uint idx,Value *elt)

{
  ostream *poVar1;
  undefined8 uVar2;
  iterator __position;
  iterator __first;
  iterator __last;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *in_RDX;
  byte *in_RSI;
  uint in_R8D;
  int *in_R9;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elts;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *elts_1;
  stringstream ss;
  string *in_stack_fffffffffffffd48;
  LocationRange *in_stack_fffffffffffffd50;
  Interpreter *in_stack_fffffffffffffd58;
  vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
  *in_stack_fffffffffffffd90;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  in_stack_fffffffffffffd98;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  in_stack_fffffffffffffda0;
  const_iterator in_stack_fffffffffffffda8;
  string local_1e8 [48];
  stringstream local_1b8 [16];
  ostream local_1a8 [388];
  uint local_24;
  __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  *local_18;
  byte *local_10;
  
  if (*in_R9 != 0) {
    if (*in_R9 != 0x10) {
      local_24 = in_R8D;
      std::__cxx11::stringstream::stringstream(local_1b8);
      poVar1 = std::operator<<(local_1a8,"expected array but arr[");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_24);
      poVar1 = std::operator<<(poVar1,"] was ");
      (anonymous_namespace)::type_str_abi_cxx11_((Value *)in_stack_fffffffffffffd48);
      std::operator<<(poVar1,local_1e8);
      std::__cxx11::string::~string(local_1e8);
      uVar2 = __cxa_allocate_exception(0x38);
      Stack::top((Stack *)0x23aa0c);
      std::__cxx11::stringstream::str();
      makeError(in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
      __cxa_throw(uVar2,&RuntimeError::typeinfo,RuntimeError::~RuntimeError);
    }
    local_18 = in_RDX;
    local_10 = in_RSI;
    if ((*in_RSI & 1) == 0) {
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)in_stack_fffffffffffffd48);
      __gnu_cxx::
      __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk*const*,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>
      ::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**>
                ((__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*const_*,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)in_stack_fffffffffffffd50,
                 (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                  *)in_stack_fffffffffffffd48);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
               *)in_stack_fffffffffffffd48);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
      ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             *)in_stack_fffffffffffffd48);
      std::
      vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
      ::
      insert<__gnu_cxx::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,void>
                (in_stack_fffffffffffffd90,in_stack_fffffffffffffda8,in_stack_fffffffffffffda0,
                 in_stack_fffffffffffffd98);
    }
    *local_10 = 0;
    __position = std::
                 vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                 ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                        *)in_stack_fffffffffffffd48);
    __gnu_cxx::
    __normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk*const*,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>
    ::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**>
              (local_18,(__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                         *)in_stack_fffffffffffffd48);
    __first = std::
              vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
              ::begin((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                       *)in_stack_fffffffffffffd48);
    __last = std::
             vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
             ::end((vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>
                    *)in_stack_fffffffffffffd48);
    std::
    vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>
    ::
    insert<__gnu_cxx::__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk**,std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk*,std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk*>>>,void>
              (in_stack_fffffffffffffd90,(const_iterator)__position._M_current,
               (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                )__first._M_current,
               (__normal_iterator<jsonnet::internal::(anonymous_namespace)::HeapThunk_**,_std::vector<jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::allocator<jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
                )__last._M_current);
  }
  return;
}

Assistant:

void joinArray(bool &first, std::vector<HeapThunk*> &running, const Value &sep, unsigned idx,
                   const Value &elt)
    {
        if (elt.t == Value::NULL_TYPE) {
            return;
        }
        if (elt.t != Value::ARRAY) {
            std::stringstream ss;
            ss << "expected array but arr[" << idx << "] was " << type_str(elt);
            throw makeError(stack.top().location, ss.str());
        }
        if (!first) {
            auto& elts = static_cast<HeapArray *>(sep.v.h)->elements;
            running.insert(running.end(), elts.begin(), elts.end());
        }
        first = false;
        auto& elts = static_cast<HeapArray *>(elt.v.h)->elements;
        running.insert(running.end(), elts.begin(), elts.end());
    }